

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot_async.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> *
equalize_histogram(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                  vector<int,_std::allocator<int>_> *iterations_histogram,int max_iterations)

{
  int iVar1;
  int iVar2;
  long lVar3;
  pointer piVar4;
  pointer pfVar5;
  long lVar6;
  long lVar7;
  pointer piVar8;
  float fVar9;
  vector<int,_std::allocator<int>_> cdf;
  allocator_type local_49;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,
             (long)(iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_49);
  std::
  partial_sum<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_48._M_impl.super__Vector_impl_data._M_start);
  lVar3 = (long)local_48._M_impl.super__Vector_impl_data._M_finish -
          (long)local_48._M_impl.super__Vector_impl_data._M_start;
  piVar4 = local_48._M_impl.super__Vector_impl_data._M_start;
  lVar6 = lVar3;
  for (lVar7 = lVar3 >> 4; 0 < lVar7; lVar7 = lVar7 + -1) {
    piVar8 = piVar4;
    if (0 < *piVar4) goto LAB_00105fdf;
    if (0 < piVar4[1]) {
      piVar8 = piVar4 + 1;
      goto LAB_00105fdf;
    }
    if (0 < piVar4[2]) {
      piVar8 = piVar4 + 2;
      goto LAB_00105fdf;
    }
    if (0 < piVar4[3]) {
      piVar8 = piVar4 + 3;
      goto LAB_00105fdf;
    }
    piVar4 = piVar4 + 4;
    lVar6 = lVar6 + -0x10;
  }
  lVar6 = lVar6 >> 2;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      piVar8 = local_48._M_impl.super__Vector_impl_data._M_finish;
      if ((lVar6 != 3) || (piVar8 = piVar4, 0 < *piVar4)) goto LAB_00105fdf;
      piVar4 = piVar4 + 1;
    }
    piVar8 = piVar4;
    if (0 < *piVar4) goto LAB_00105fdf;
    piVar4 = piVar4 + 1;
  }
  piVar8 = local_48._M_impl.super__Vector_impl_data._M_finish;
  if (0 < *piVar4) {
    piVar8 = piVar4;
  }
LAB_00105fdf:
  iVar1 = *(int *)((long)local_48._M_impl.super__Vector_impl_data._M_start + lVar3 + -4);
  iVar2 = *piVar8;
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,
             (long)(iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(iterations_histogram->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_49);
  pfVar5 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (; local_48._M_impl.super__Vector_impl_data._M_start !=
         local_48._M_impl.super__Vector_impl_data._M_finish;
      local_48._M_impl.super__Vector_impl_data._M_start =
           local_48._M_impl.super__Vector_impl_data._M_start + 1) {
    if (*local_48._M_impl.super__Vector_impl_data._M_start < 1) {
      fVar9 = 0.0;
    }
    else {
      fVar9 = (float)(*local_48._M_impl.super__Vector_impl_data._M_start - *piVar8) *
              ((float)max_iterations / (float)(iVar1 - iVar2));
    }
    *pfVar5 = fVar9;
    pfVar5 = pfVar5 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> equalize_histogram(const std::vector<int>& iterations_histogram, const int max_iterations)
{
    // Calculate the CDF (Cumulative Distribution Function) by accumulating all iteration counts.
    // Element [0] is unused and iterations_histogram[max_iterations] should be zero (as we do not count
    // the iterations of the points inside the Mandelbrot Set).
    std::vector<int> cdf(iterations_histogram.size());
    std::partial_sum(iterations_histogram.cbegin(), iterations_histogram.cend(), cdf.begin());

    // Get the minimum value in the CDF that is bigger than zero and the sum of all iteration counts
    // from iterations_histogram (which is the last value of the CDF).
    const auto cdf_min = std::find_if(cdf.cbegin(), cdf.cend(), [](auto n) { return n > 0; });
    const auto total_iterations = cdf[cdf.size() - 1];

    // normalize all values from the CDF that are bigger than zero to a range of 0.0 .. max_iterations
    const auto f = static_cast<float>(max_iterations) / static_cast<float>(total_iterations - *cdf_min);
    std::vector<float> equalized_iterations(iterations_histogram.size());
    std::transform(cdf.cbegin(), cdf.cend(), equalized_iterations.begin(),
                   [=](const auto& c) { return c > 0 ? f * static_cast<float>(c - *cdf_min) : 0.0f; });

    return equalized_iterations;
}